

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_unlink(lyd_node *node)

{
  lyd_node *plVar1;
  ly_bool lVar2;
  lyd_node *in_RAX;
  lyd_node *leader;
  lyd_node *local_18;
  
  if (node != (lyd_node *)0x0) {
    local_18 = in_RAX;
    lVar2 = lyds_is_supported(node);
    if (lVar2 != '\0') {
      plVar1 = node;
      if (((node->prev->next != (lyd_node *)0x0) &&
          (plVar1 = node, node->prev->schema == node->schema)) &&
         (lyd_find_sibling_val(node,node->schema,(char *)0x0,0,&local_18), plVar1 = local_18,
         local_18 == (lyd_node *)0x0)) {
        __assert_fail("leader",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                      ,0x4c1,"void lyd_unlink(struct lyd_node *)");
      }
      local_18 = plVar1;
      lyds_unlink(&local_18,node);
    }
    lyd_unlink_ignore_lyds((lyd_node **)0x0,node);
  }
  return;
}

Assistant:

void
lyd_unlink(struct lyd_node *node)
{
    struct lyd_node *leader;

    if (!node) {
        return;
    }

    /* unlink from the lyds tree */
    if (lyds_is_supported(node)) {
        if (!node->prev->next || (node->prev->schema != node->schema)) {
            leader = node;
        } else {
            lyd_find_sibling_val(node, node->schema, NULL, 0, &leader);
            assert(leader);
        }
        lyds_unlink(&leader, node);
    }

    /* unlink data tree */
    lyd_unlink_ignore_lyds(NULL, node);
}